

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O0

int lquerytype(lua_State *L)

{
  sproto *sp_00;
  char *type_name_00;
  sproto_type *p;
  sproto_type *st;
  sproto *sp;
  char *type_name;
  lua_State *L_local;
  
  sp_00 = (sproto *)lua_touserdata(L,1);
  if (sp_00 == (sproto *)0x0) {
    L_local._4_4_ = luaL_argerror(L,1,"Need a sproto object");
  }
  else {
    type_name_00 = luaL_checklstring(L,2,(size_t *)0x0);
    p = sproto_type(sp_00,type_name_00);
    if (p == (sproto_type *)0x0) {
      L_local._4_4_ = luaL_error(L,"type %s not found",type_name_00);
    }
    else {
      lua_pushlightuserdata(L,p);
      L_local._4_4_ = 1;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int
lquerytype(lua_State *L) {
	const char * type_name;
	struct sproto *sp = lua_touserdata(L,1);
	struct sproto_type *st;
	if (sp == NULL) {
		return luaL_argerror(L, 1, "Need a sproto object");
	}
	type_name = luaL_checkstring(L,2);
	st = sproto_type(sp, type_name);
	if (st) {
		lua_pushlightuserdata(L, st);
		return 1;
	}

	return luaL_error(L, "type %s not found", type_name);
}